

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O2

uint32_t * unpack23_8(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint uVar1;
  
  *out = (*in & 0x7fffff) + base;
  uVar1 = *in;
  out[1] = uVar1 >> 0x17;
  out[1] = (uVar1 >> 0x17) + base + (in[1] & 0x3fff) * 0x200;
  uVar1 = in[1];
  out[2] = uVar1 >> 0xe;
  out[2] = (uVar1 >> 0xe) + base + (in[2] & 0x1f) * 0x40000;
  out[3] = (in[2] >> 5 & 0x7fffff) + base;
  uVar1 = in[2];
  out[4] = uVar1 >> 0x1c;
  out[4] = (uVar1 >> 0x1c) + base + (in[3] & 0x7ffff) * 0x10;
  uVar1 = in[3];
  out[5] = uVar1 >> 0x13;
  out[5] = (uVar1 >> 0x13) + base + (in[4] & 0x3ff) * 0x2000;
  uVar1 = in[4];
  out[6] = uVar1 >> 10;
  out[6] = (uVar1 >> 10) + base + (in[5] & 1) * 0x400000;
  out[7] = (in[5] >> 1 & 0x7fffff) + base;
  return in + 6;
}

Assistant:

uint32_t * unpack23_8( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out = ( (*in) >>  0  )   % (1U << 23 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  23  ) ;
    ++in;
    *out |= ((*in) % (1U<< 14 ))<<( 23 - 14 );
    *out += base;
    out++;
    *out = ( (*in) >>  14  ) ;
    ++in;
    *out |= ((*in) % (1U<< 5 ))<<( 23 - 5 );
    *out += base;
    out++;
    *out = ( (*in) >>  5  )   % (1U << 23 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  28  ) ;
    ++in;
    *out |= ((*in) % (1U<< 19 ))<<( 23 - 19 );
    *out += base;
    out++;
    *out = ( (*in) >>  19  ) ;
    ++in;
    *out |= ((*in) % (1U<< 10 ))<<( 23 - 10 );
    *out += base;
    out++;
    *out = ( (*in) >>  10  ) ;
    ++in;
    *out |= ((*in) % (1U<< 1 ))<<( 23 - 1 );
    *out += base;
    out++;
    *out = ( (*in) >>  1  )   % (1U << 23 )  ;
    *out += base;
    out++;

    return in + 1;
}